

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O3

cmStateSnapshot * __thiscall
cmStateSnapshot::GetCallStackParent(cmStateSnapshot *__return_storage_ptr__,cmStateSnapshot *this)

{
  bool bVar1;
  PointerType pSVar2;
  iterator other;
  iterator other_00;
  PositionType parentPos;
  iterator local_28;
  
  if (this->State == (cmState *)0x0) {
    __assert_fail("this->State",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x5a,"cmStateSnapshot cmStateSnapshot::GetCallStackParent() const");
  }
  other.Tree = &this->State->SnapshotData;
  other.Position = 0;
  bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=(&this->Position,other)
  ;
  if (!bVar1) {
    __assert_fail("this->Position != this->State->SnapshotData.Root()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x5b,"cmStateSnapshot cmStateSnapshot::GetCallStackParent() const");
  }
  __return_storage_ptr__->State = (cmState *)0x0;
  (__return_storage_ptr__->Position).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  (__return_storage_ptr__->Position).Position = 0;
  local_28.Tree = (this->Position).Tree;
  local_28.Position = (this->Position).Position;
  while ((pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_28),
         pSVar2->SnapshotType == PolicyScopeType ||
         (pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_28),
         pSVar2->SnapshotType == VariableScopeType))) {
    cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++(&local_28);
  }
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_28);
  if ((pSVar2->SnapshotType != BuildsystemDirectoryType) &&
     (pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_28),
     pSVar2->SnapshotType != BaseType)) {
    do {
      do {
        cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++(&local_28);
        pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_28);
      } while (pSVar2->SnapshotType == PolicyScopeType);
      pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_28);
    } while (pSVar2->SnapshotType == VariableScopeType);
    other_00.Tree = &this->State->SnapshotData;
    other_00.Position = 0;
    bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==(&local_28,other_00);
    if (!bVar1) {
      __return_storage_ptr__->State = this->State;
      (__return_storage_ptr__->Position).Tree = local_28.Tree;
      (__return_storage_ptr__->Position).Position = local_28.Position;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmStateSnapshot::GetCallStackParent() const
{
  assert(this->State);
  assert(this->Position != this->State->SnapshotData.Root());

  cmStateSnapshot snapshot;
  cmStateDetail::PositionType parentPos = this->Position;
  while (parentPos->SnapshotType == cmStateEnums::PolicyScopeType ||
         parentPos->SnapshotType == cmStateEnums::VariableScopeType) {
    ++parentPos;
  }
  if (parentPos->SnapshotType == cmStateEnums::BuildsystemDirectoryType ||
      parentPos->SnapshotType == cmStateEnums::BaseType) {
    return snapshot;
  }

  ++parentPos;
  while (parentPos->SnapshotType == cmStateEnums::PolicyScopeType ||
         parentPos->SnapshotType == cmStateEnums::VariableScopeType) {
    ++parentPos;
  }

  if (parentPos == this->State->SnapshotData.Root()) {
    return snapshot;
  }

  snapshot = cmStateSnapshot(this->State, parentPos);
  return snapshot;
}